

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O1

uint32_t virtio_rx_batch(ixy_device *ixy,uint16_t queue_id,pkt_buf **bufs,uint32_t num_bufs)

{
  size_t size;
  uint32_t uVar1;
  long lVar2;
  uint *puVar3;
  long *plVar4;
  long lVar5;
  short sVar6;
  int iVar7;
  ulong in_RAX;
  undefined8 *puVar8;
  pkt_buf *ppVar9;
  ssize_t sVar10;
  undefined8 extraout_RAX;
  void *pvVar11;
  uint *puVar12;
  mempool *pmVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long extraout_RDX;
  ulong uVar17;
  undefined8 unaff_RBP;
  ushort uVar18;
  int __fd;
  long lVar19;
  long lVar20;
  ulong unaff_R13;
  ulong uVar21;
  ulong unaff_R15;
  dma_memory dVar22;
  ushort auStack_2d0 [256];
  ulong uStack_d0;
  void *pvStack_c8;
  ulong uStack_c0;
  ushort uStack_b6;
  ushort uStack_b4;
  short sStack_b2;
  ulong uStack_b0;
  void *pvStack_a8;
  uintptr_t uStack_a0;
  undefined4 uStack_94;
  ulong uStack_90;
  uint *puStack_88;
  ulong uStack_80;
  mempool *pmStack_78;
  code *pcStack_68;
  undefined8 uStack_60;
  ixy_device *piStack_58;
  uint *puStack_50;
  ulong uStack_48;
  code *pcStack_40;
  undefined8 uStack_38;
  
  puVar12 = (uint *)ixy[1].driver_name;
  uStack_38 = in_RAX;
  if (num_bufs == 0) {
    uVar21 = 0;
  }
  else {
    uVar21 = 0;
    do {
      uVar18 = (ushort)puVar12[10];
      lVar2 = *(long *)(puVar12 + 6);
      if (uVar18 == *(ushort *)(lVar2 + 2)) goto LAB_00106b56;
      uVar17 = (ulong)uVar18 % (ulong)*puVar12;
      lVar20 = (ulong)*(uint *)(lVar2 + 4 + uVar17 * 8) * 0x10;
      *(ushort *)(puVar12 + 10) = uVar18 + 1;
      uVar18 = *(ushort *)(*(long *)(puVar12 + 2) + 0xc + lVar20);
      pmVar13 = (mempool *)(ulong)uVar18;
      if (uVar18 != 2) {
        pcStack_40 = (code *)0x106c42;
        virtio_rx_batch_cold_1();
        goto LAB_00106c42;
      }
      puVar8 = (undefined8 *)(*(long *)(puVar12 + 2) + lVar20);
      *puVar8 = 0;
      puVar8[1] = 0;
      ppVar9 = *(pkt_buf **)(puVar12 + (ulong)*(uint *)(lVar2 + 4 + uVar17 * 8) * 2 + 0xe);
      uVar15 = *(int *)(lVar2 + 8 + uVar17 * 8) - 10;
      ppVar9->size = uVar15;
      bufs[uVar21] = ppVar9;
      ixy[1].set_promisc = ixy[1].set_promisc + uVar15;
      ixy[1].tx_batch = ixy[1].tx_batch + 1;
      uVar21 = uVar21 + 1;
    } while (num_bufs != uVar21);
    uVar21 = (ulong)num_bufs;
  }
LAB_00106b56:
  if (*puVar12 != 0) {
    unaff_RBP = 0;
    unaff_R13 = 0;
    do {
      unaff_R15 = unaff_R13 & 0xffff;
      num_bufs = (int)unaff_R15 << 4;
      if (*(long *)(*(long *)(puVar12 + 2) + (ulong)num_bufs) == 0) {
        pmVar13 = *(mempool **)(puVar12 + 0xc);
        pcStack_40 = (code *)0x106b8a;
        ppVar9 = pkt_buf_alloc(pmVar13);
        if (ppVar9 == (pkt_buf *)0x0) goto LAB_00106c42;
        uVar1 = *(uint32_t *)(*(long *)(puVar12 + 0xc) + 8);
        ppVar9->size = uVar1;
        ppVar9->head_room[0x26] = '\0';
        ppVar9->head_room[0x27] = '\0';
        ppVar9->head_room[0x1e] = '\0';
        ppVar9->head_room[0x1f] = '\0';
        ppVar9->head_room[0x20] = '*';
        ppVar9->head_room[0x21] = '\0';
        ppVar9->head_room[0x22] = '\0';
        ppVar9->head_room[0x23] = '\0';
        ppVar9->head_room[0x24] = '\0';
        ppVar9->head_room[0x25] = '\0';
        lVar2 = *(long *)(puVar12 + 2);
        uVar17 = (ulong)(uint)((int)unaff_R15 << 4);
        *(uint32_t *)(lVar2 + 8 + uVar17) = uVar1 + 10;
        *(uintptr_t *)(lVar2 + uVar17) = ppVar9->buf_addr_phy + 0x36;
        *(undefined4 *)(lVar2 + 0xc + uVar17) = 2;
        *(pkt_buf **)(puVar12 + unaff_R15 * 2 + 0xe) = ppVar9;
        *(short *)(*(long *)(puVar12 + 4) + 4 +
                  ((ulong)*(ushort *)(*(long *)(puVar12 + 4) + 2) % (ulong)*puVar12) * 2) =
             (short)unaff_R13;
        *(short *)(*(long *)(puVar12 + 4) + 2) = *(short *)(*(long *)(puVar12 + 4) + 2) + 1;
        pmVar13 = (mempool *)(ulong)*(uint *)&ixy[1].pci_addr;
        uStack_38 = uStack_38 & 0xffffffffffff;
        num_bufs = 0x10;
        pcStack_40 = (code *)0x106c14;
        sVar10 = pwrite(*(uint *)&ixy[1].pci_addr,(void *)((long)&uStack_38 + 6),2,0x10);
        if (sVar10 != 2) goto LAB_00106c47;
      }
      uVar15 = (int)unaff_R13 + 1;
      unaff_R13 = (ulong)uVar15;
    } while ((uVar15 & 0xffff) < *puVar12);
  }
  return (uint32_t)uVar21;
LAB_00106c42:
  pcStack_40 = (code *)0x106c47;
  virtio_rx_batch_cold_3();
LAB_00106c47:
  pcStack_40 = virtio_tx_batch;
  virtio_rx_batch_cold_2();
  uVar17 = (ulong)num_bufs;
  puVar3 = *(uint **)&pmVar13[5].buf_size;
  uStack_60 = extraout_RAX;
  piStack_58 = ixy;
  puStack_50 = puVar12;
  uStack_48 = uVar21;
  pcStack_40 = (code *)unaff_R15;
  while( true ) {
    if ((ushort)puVar3[10] == *(ushort *)(*(long *)(puVar3 + 6) + 2)) break;
    lVar2 = *(long *)(puVar3 + 2);
    uVar21 = (ulong)*(uint *)(*(long *)(puVar3 + 6) + 4 +
                             ((ulong)(ushort)puVar3[10] % (ulong)*puVar3) * 8);
    lVar20 = uVar21 * 0x10;
    *(undefined8 *)(lVar2 + lVar20) = 0;
    *(undefined4 *)(lVar2 + 8 + lVar20) = 0;
    pcStack_68 = (code *)0x106caa;
    pkt_buf_free(*(pkt_buf **)(puVar3 + uVar21 * 2 + 0xe));
    *(short *)(puVar3 + 10) = (short)puVar3[10] + 1;
  }
  if (num_bufs == 0) {
    uVar17 = 0;
  }
  else {
    uVar21 = 0;
    uVar18 = 0;
    do {
      uVar15 = *puVar3;
      uVar16 = (uint)uVar18;
      if (uVar18 < uVar15) {
        lVar2 = *(long *)(*(long *)(puVar3 + 2) + (ulong)uVar18 * 0x10);
        while (lVar2 != 0) {
          uVar18 = uVar18 + 1;
          uVar16 = (uint)uVar18;
          if (uVar15 <= uVar18) break;
          lVar2 = *(long *)(*(long *)(puVar3 + 2) + (ulong)uVar18 * 0x10);
        }
      }
      if (uVar15 == uVar16) {
        uVar17 = uVar21 & 0xffffffff;
        break;
      }
      plVar4 = *(long **)(extraout_RDX + uVar21 * 8);
      uVar15 = *(uint *)((long)plVar4 + 0x14);
      pmVar13[7].base_addr = (void *)((long)pmVar13[7].base_addr + (ulong)uVar15);
      *(long *)&pmVar13[6].buf_size = *(long *)&pmVar13[6].buf_size + 1;
      *(long **)(puVar3 + (ulong)uVar18 * 2 + 0xe) = plVar4;
      *(undefined2 *)((long)plVar4 + 0x3e) = 0;
      *(undefined8 *)((long)plVar4 + 0x36) = 0x2a0000;
      lVar2 = *(long *)(puVar3 + 2);
      lVar20 = (ulong)uVar18 * 0x10;
      *(uint *)(lVar2 + 8 + lVar20) = uVar15 + 10;
      *(long *)(lVar2 + lVar20) = *plVar4 + 0x36;
      *(undefined4 *)(lVar2 + 0xc + lVar20) = 0;
      *(ushort *)
       (*(long *)(puVar3 + 4) + 4 +
       ((ulong)((uint)*(ushort *)(*(long *)(puVar3 + 4) + 2) + (int)uVar21) % (ulong)*puVar3) * 2) =
           uVar18;
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar17);
  }
  *(short *)(*(long *)(puVar3 + 4) + 2) = *(short *)(*(long *)(puVar3 + 4) + 2) + (short)uVar17;
  uVar21 = (ulong)pmVar13[4].free_stack_top;
  pvVar11 = (void *)((long)&uStack_60 + 6);
  uStack_60 = CONCAT26(1,(undefined6)uStack_60);
  pcStack_68 = (code *)0x106db2;
  sVar10 = pwrite(pmVar13[4].free_stack_top,pvVar11,2,0x10);
  uVar15 = (uint)pvVar11;
  if (sVar10 == 2) {
    return (uint32_t)uVar17;
  }
  pcStack_68 = virtio_legacy_setup_tx_queue;
  virtio_tx_batch_cold_1();
  sVar6 = (short)uVar15;
  uStack_90 = uVar17;
  puStack_88 = puVar3;
  uStack_80 = unaff_R13;
  pmStack_78 = pmVar13;
  pcStack_68 = (code *)unaff_RBP;
  if ((ushort)(sVar6 - 3U) < 0xfffe) {
    uStack_d0 = 0x10708a;
    virtio_legacy_setup_tx_queue_cold_5();
    __fd = (int)uVar21;
LAB_0010708a:
    uStack_d0 = 0x10708f;
    virtio_legacy_setup_tx_queue_cold_1();
LAB_0010708f:
    uStack_d0 = 0x107094;
    virtio_legacy_setup_tx_queue_cold_2();
  }
  else {
    __fd = *(int *)(uVar21 + 0x70);
    uStack_d0 = 0x106e08;
    sStack_b2 = sVar6;
    sVar10 = pwrite(__fd,&sStack_b2,2,0xe);
    uVar17 = uVar21;
    if (sVar10 != 2) goto LAB_0010708a;
    __fd = *(int *)(uVar21 + 0x70);
    uStack_d0 = 0x106e29;
    sVar10 = pread(__fd,&uStack_b6,2,0xc);
    if (sVar10 != 2) goto LAB_0010708f;
    pvStack_c8 = (void *)CONCAT44(pvStack_c8._4_4_,(uint)uStack_b6);
    uStack_d0 = 0x106e6d;
    uVar15 = fprintf(_stderr,"[DEBUG] %s:%d %s(): Max queue size of tx queue #%u: %u\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                     ,0x37,"virtio_legacy_setup_tx_queue",(ulong)(uVar15 & 0xffff));
    uVar14 = (ulong)uVar15;
    uVar15 = (uint)uStack_b6;
    if (uStack_b6 == 0) {
LAB_00106e72:
      return (uint32_t)uVar14;
    }
    uStack_b0 = (ulong)uVar15;
    size = (ulong)(((uint)uStack_b6 + (uint)uStack_b6 * 8) * 2 + 0x1003 & 0x3ff000) + 4 +
           uStack_b0 * 8;
    uStack_d0 = 0x106eab;
    dVar22 = memory_allocate_dma(size,true);
    uStack_a0 = dVar22.phy;
    pvVar11 = dVar22.virt;
    uStack_d0 = 0x106ec3;
    memset(pvVar11,0xab,size);
    uStack_d0 = 0x106ef4;
    pvStack_c8 = pvVar11;
    pvStack_a8 = pvVar11;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Allocated %zu bytes for virt queue at %p\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x3e,"virtio_legacy_setup_tx_queue",size);
    __fd = *(int *)(uVar21 + 0x70);
    uStack_94 = (undefined4)(uStack_a0 >> 0xc);
    uStack_d0 = 0x106f16;
    sVar10 = pwrite(__fd,&uStack_94,4,8);
    if (sVar10 == 4) {
      uStack_d0 = 0x106f32;
      puVar12 = (uint *)calloc(1,(ulong)uStack_b6 * 8 + 0x38);
      *puVar12 = uVar15;
      *(void **)(puVar12 + 2) = pvStack_a8;
      pvStack_c8 = (void *)((ulong)(uint)((int)uStack_b0 << 4) + (long)pvStack_a8);
      *(void **)(puVar12 + 4) = pvStack_c8;
      uStack_c0 = (long)pvStack_c8 + uStack_b0 * 2 + 0x1003 & 0xfffffffffffff000;
      *(ulong *)(puVar12 + 6) = uStack_c0;
      uStack_d0 = 0x106f95;
      fprintf(_stderr,"[DEBUG] %s:%d %s(): vring desc: %p, vring avail: %p, vring used: %p\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0x44,"virtio_legacy_setup_tx_queue");
      uVar16 = *puVar12;
      if ((ulong)uVar16 != 0) {
        lVar2 = *(long *)(puVar12 + 2);
        lVar20 = *(long *)(puVar12 + 4);
        lVar5 = *(long *)(puVar12 + 6);
        lVar19 = 0;
        do {
          puVar8 = (undefined8 *)(lVar2 + lVar19 * 8);
          *puVar8 = 0;
          puVar8[1] = 0;
          *(undefined2 *)(lVar20 + 4 + lVar19) = 0;
          *(undefined8 *)(lVar5 + 4 + lVar19 * 4) = 0;
          lVar19 = lVar19 + 2;
        } while ((ulong)uVar16 * 2 != lVar19);
      }
      *(undefined2 *)(*(long *)(puVar12 + 6) + 2) = 0;
      *(undefined2 *)(*(long *)(puVar12 + 4) + 2) = 0;
      *(undefined2 *)(puVar12 + 10) = 0;
      __fd = *(int *)(uVar21 + 0x70);
      uStack_d0 = 0x107005;
      sVar10 = pread(__fd,&uStack_b4,2,0x10);
      if (sVar10 == 2) {
        uStack_d0 = 0x10703c;
        fprintf(_stderr,"[DEBUG] %s:%d %s(): vq notifcation offset %u\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                ,0x54,"virtio_legacy_setup_tx_queue",(ulong)uStack_b4);
        *(ulong *)(puVar12 + 8) = (ulong)uStack_b4;
        if (sVar6 == 2) {
          uStack_d0 = 0x107055;
          pmVar13 = memory_allocate_mempool(uVar15,0x800);
          *(mempool **)(puVar12 + 0xc) = pmVar13;
        }
        **(undefined2 **)(puVar12 + 4) = 1;
        **(undefined2 **)(puVar12 + 6) = 0;
        uVar14 = (ulong)(sVar6 != 1);
        *(uint **)(uVar21 + 0x80 + uVar14 * 8) = puVar12;
        goto LAB_00106e72;
      }
      goto LAB_00107099;
    }
  }
  uStack_d0 = 0x107099;
  virtio_legacy_setup_tx_queue_cold_3();
LAB_00107099:
  uStack_d0 = 0x10709e;
  virtio_legacy_setup_tx_queue_cold_4();
  uStack_d0 = uVar17;
  iVar7 = ioctl(__fd,0x3b6c);
  if (iVar7 == -1) {
    vfio_enable_dma_cold_1();
  }
  else {
    auStack_2d0[0] = 0;
    sVar10 = pread(__fd,auStack_2d0,2,4);
    if (sVar10 == 2) {
      auStack_2d0[0] = auStack_2d0[0] | 4;
      sVar10 = pwrite(__fd,auStack_2d0,2,4);
      if (sVar10 == 2) {
        return 2;
      }
      __assert_fail("pwrite(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                    ,0x27,"void vfio_enable_dma(int)");
    }
  }
  __assert_fail("pread(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                ,0x25,"void vfio_enable_dma(int)");
}

Assistant:

uint32_t virtio_rx_batch(struct ixy_device* ixy, uint16_t queue_id, struct pkt_buf* bufs[], uint32_t num_bufs) {
	struct virtio_device* dev = IXY_TO_VIRTIO(ixy);
	struct virtqueue* vq = dev->rx_queue;
	uint32_t buf_idx;

	_mm_mfence();
	// Retrieve used bufs from the device
	for (buf_idx = 0; buf_idx < num_bufs; ++buf_idx) {
		// Section 3.2.2
		if (vq->vq_used_last_idx == vq->vring.used->idx) {
			break;
		}
		// info("Rx packet: last used %u, used idx %u", vq->vq_used_last_idx,
		// vq->vring.used->idx);
		struct vring_used_elem* e = vq->vring.used->ring + (vq->vq_used_last_idx % vq->vring.num);
		// info("Used elem %p, id %u len %u", e, e->id, e->len);
		struct vring_desc* desc = &vq->vring.desc[e->id];
		vq->vq_used_last_idx++;
		// We don't support chaining or indirect descriptors
		if (desc->flags != VRING_DESC_F_WRITE) {
			error("unsupported rx flags on descriptor: %x", desc->flags);
		}
		// info("Desc %lu %u %u %u", desc->addr, desc->len, desc->flags,
		// desc->next);
		*desc = (struct vring_desc){};

		// Section 5.1.6.4
		struct pkt_buf* buf = vq->virtual_addresses[e->id];
		buf->size = e->len - sizeof(net_hdr);
		bufs[buf_idx] = buf;
		//struct virtio_net_hdr* hdr = (void*)(buf->head_room + sizeof(buf->head_room) - sizeof(net_hdr));

		// Update rx counter
		dev->rx_bytes += buf->size;
		dev->rx_pkts++;
	}
	// Fill empty slots in descriptor table
	for (uint16_t idx = 0; idx < vq->vring.num; ++idx) {
		struct vring_desc* desc = &vq->vring.desc[idx];
		if (desc->addr != 0) { // descriptor points to something, therefore it is in use
			continue;
		}
		// info("Found free desc slot at %u (%u)", idx, vq->vring.num);
		struct pkt_buf* buf = pkt_buf_alloc(vq->mempool);
		if (!buf) {
			error("failed to allocate new mbuf for rx, you are either leaking memory or your mempool is too small");
		}
		buf->size = vq->mempool->buf_size;
		memcpy(buf->head_room + sizeof(buf->head_room) - sizeof(net_hdr), &net_hdr, sizeof(net_hdr));
		vq->vring.desc[idx].len = buf->size + sizeof(net_hdr);
		vq->vring.desc[idx].addr =
			buf->buf_addr_phy + offsetof(struct pkt_buf, head_room) + sizeof(buf->head_room) - sizeof(net_hdr);
		vq->vring.desc[idx].flags = VRING_DESC_F_WRITE;
		vq->vring.desc[idx].next = 0;
		vq->virtual_addresses[idx] = buf;
		vq->vring.avail->ring[vq->vring.avail->idx % vq->vring.num] = idx;
		_mm_mfence(); // Make sure exposed descriptors reach device before index is updated
		vq->vring.avail->idx++;
		_mm_mfence(); // Make sure the index update reaches device before it is triggered
		virtio_legacy_notify_queue(dev, 0);
	}
	return buf_idx;
}